

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                 *this,TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                       *cp)

{
  long in_RSI;
  TPZFileEqnStorage<std::complex<long_double>_> *in_RDI;
  TPZFileEqnStorage<std::complex<long_double>_> *unaff_retaddr;
  TPZAbstractFrontMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZVec<int> *copy;
  TPZFileEqnStorage<std::complex<long_double>_> *pTVar1;
  
  pTVar1 = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<long_double>,TPZFileEqnStorage<std::complex<long_double>>,TPZFrontSym<std::complex<long_double>>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<long_double>_>::TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<std::complex<long_double>_> *)in_RDI,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  (in_RDI->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontMatrix_02545c40;
  TPZFileEqnStorage<std::complex<long_double>_>::TPZFileEqnStorage(unaff_retaddr,pTVar1);
  copy = (TPZVec<int> *)
         &in_RDI[1].fBlockPos.super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements;
  TPZFrontSym<std::complex<long_double>_>::TPZFrontSym
            ((TPZFrontSym<std::complex<long_double>_> *)in_RDI,
             (TPZFrontSym<std::complex<long_double>_> *)copy);
  in_RDI[2].fFileName.field_2._M_allocated_capacity = *(size_type *)(in_RSI + 0x200);
  *(undefined8 *)((long)&in_RDI[2].fFileName.field_2 + 8) = *(undefined8 *)(in_RSI + 0x208);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,copy);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_RDI,copy);
  return;
}

Assistant:

TPZFrontMatrix(const TPZFrontMatrix &cp) : TPZRegisterClassId(&TPZFrontMatrix::ClassId),TPZAbstractFrontMatrix<TVar>(cp), fStorage(cp.fStorage),
	fFront(cp.fFront),fNumEq(cp.fNumEq),fLastDecomposed(cp.fLastDecomposed), fNumElConnected(cp.fNumElConnected),fNumElConnectedBackup(cp.fNumElConnectedBackup)
    {
    }